

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O3

void __thiscall Refal2::CSetBuilder<char>::Include(CSetBuilder<char> *this,char *element)

{
  CSet tmp;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> _Stack_38;
  
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
  _M_insert_unique<char_const&>
            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
             &_Stack_38,element);
  Include(this,(CSet *)&_Stack_38);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&_Stack_38);
  return;
}

Assistant:

void CSetBuilder<T>::Include( const T& element )
{
	CSet tmp;
	tmp.insert( element );
	Include( tmp );
}